

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car.cpp
# Opt level: O3

void __thiscall Car::move(Car *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  timespec local_30;
  
  if (this->_active == true) {
    do {
      uVar1 = this->_delay;
      if (0 < (long)(int)uVar1) {
        local_30.tv_sec = (ulong)uVar1 / 1000;
        local_30.tv_nsec = (local_30.tv_sec * -1000 + (long)(int)uVar1) * 1000000;
        do {
          iVar2 = nanosleep(&local_30,&local_30);
          if (iVar2 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
      iVar2 = std::__cxx11::string::compare((char *)&this->_axis);
      if (iVar2 == 0) {
        iVar3 = get_xpos(this);
        iVar3 = iVar3 + this->_speed;
        iVar2 = 0;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        if (this->_limit < iVar3) {
          iVar2 = this->_limit + -5;
        }
        set_xpos(this,iVar2);
      }
      else {
        iVar3 = get_ypos(this);
        iVar3 = iVar3 + this->_speed;
        iVar2 = 0;
        if (0 < iVar3) {
          iVar2 = iVar3;
        }
        if (this->_limit < iVar3) {
          iVar2 = this->_limit + -5;
        }
        set_ypos(this,iVar2);
      }
      iVar2 = get_xpos(this);
      if (iVar2 < 0xf) {
        iVar2 = get_ypos(this);
        if (iVar2 < 0xf) {
          this->_active = false;
          this->_succeeded = true;
        }
      }
    } while (this->_active != false);
  }
  iVar2 = get_xpos(this);
  if (iVar2 < 0xf) {
    iVar2 = get_ypos(this);
    if (iVar2 < 0xf) {
      this->_succeeded = true;
    }
  }
  return;
}

Assistant:

void Car::move(){
        // horizontal
        // vertical
        while(_active){
            std::this_thread::sleep_for(std::chrono::milliseconds(_delay));
            if (_axis == "horizontal"){
                int x = get_xpos();
                set_xpos( newPos(x));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---    Pos ="<< _xpos<<std::endl;
            }else{
                int y = get_ypos();
                set_ypos(newPos(y));

                //std::cout << "Car Thread #: " <<std::this_thread::get_id()<<" ---   Pos = " <<_ypos<<std::endl;
            }
            // reached to  the correct place
            if(get_xpos()< 15 && get_ypos() <15)
                {   
                    _active = false;
                    _succeeded = true;
                }
        }
            // stopped in the correct place
              if(get_xpos()< 15 && get_ypos() <15)
                {
                    _succeeded = true;
                }

                //std::cout  << std::this_thread::get_id()<< " thread is ending\n"<< std::endl;
    }